

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O0

void __thiscall GdlGlyphClassDefn::MarkFsmClass(GdlGlyphClassDefn *this,int nPassID,int nClassID)

{
  size_type_conflict sVar1;
  reference pvVar2;
  value_type in_EDX;
  int in_ESI;
  size_type_conflict in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  vector<bool,_std::allocator<bool>_> *in_stack_00000010;
  bool in_stack_00000067;
  size_type_conflict in_stack_00000068;
  vector<bool,_std::allocator<bool>_> *in_stack_00000070;
  reference local_28;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  size_type_conflict __new_size;
  
  __new_size = in_RDI;
  sVar1 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_00000010);
  if (sVar1 < in_ESI + 1) {
    std::vector<bool,_std::allocator<bool>_>::resize
              (in_stack_00000070,in_stack_00000068,in_stack_00000067);
    in_stack_ffffffffffffffec = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::resize
              (unaff_retaddr,__new_size,(value_type_conflict1 *)CONCAT44(in_ESI,in_EDX));
  }
  local_28 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)CONCAT44(in_ESI,in_EDX),
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  std::_Bit_reference::operator=(&local_28,true);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe8),(long)in_ESI);
  *pvVar2 = in_EDX;
  return;
}

Assistant:

void GdlGlyphClassDefn::MarkFsmClass(int nPassID, int nClassID)
{
	if (m_vfFsm.size() >= unsigned(nPassID + 1))
	{
		// Once it's set it shouldn't be changed.
		Assert(!m_vfFsm[nPassID] || m_vnFsmID[nPassID] == nClassID);
	}
	else
	{
		m_vfFsm.resize(nPassID + 1, false);
		m_vnFsmID.resize(nPassID + 1, -1);
	}

	m_vfFsm[nPassID] = true;
	m_vnFsmID[nPassID] = nClassID;
}